

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O3

Boxed_Number
chaiscript::dispatch::detail::
call_func<chaiscript::dispatch::detail::Fun_Caller<chaiscript::Boxed_Number,chaiscript::Boxed_Number>,chaiscript::Boxed_Number,chaiscript::Boxed_Number,0ul>
          (element_type *param_1,undefined8 param_2,Boxed_Number *param_3,undefined8 *param_4,
          Type_Conversions_State *param_5)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Boxed_Number BVar2;
  chaiscript acStack_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  boxed_cast<chaiscript::Boxed_Number>(acStack_28,(Boxed_Value *)*param_4,param_5);
  BVar2 = Fun_Caller<chaiscript::Boxed_Number,chaiscript::Boxed_Number>::operator()
                    ((Fun_Caller<chaiscript::Boxed_Number,chaiscript::Boxed_Number> *)param_1,
                     param_3);
  _Var1._M_pi = BVar2.bv.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    _Var1._M_pi = extraout_RDX;
  }
  BVar2.bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar2.bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = param_1;
  return (Boxed_Number)
         BVar2.bv.m_data.
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ret call_func(const chaiscript::dispatch::detail::Function_Signature<Ret (Params...)> &, Indexes<I...>, const Callable &f,
            const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
        {
          (void)params; (void)t_conversions;
          return f(boxed_cast<Params>(params[I], &t_conversions)...);
        }